

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

type * __thiscall
duckdb::Deserializer::Read<duckdb::vector<duckdb::ColumnBinding,true>>(Deserializer *this)

{
  ulong uVar1;
  long *in_RSI;
  type *in_RDI;
  type tVar2;
  idx_t i;
  idx_t size;
  vector<duckdb::ColumnBinding,_true> *vec;
  idx_t in_stack_ffffffffffffff88;
  idx_t in_stack_ffffffffffffff90;
  undefined8 local_38;
  
  vector<duckdb::ColumnBinding,_true>::vector((vector<duckdb::ColumnBinding,_true> *)0xb4327f);
  uVar1 = (**(code **)(*in_RSI + 0x40))();
  tVar2.column_index = in_stack_ffffffffffffff88;
  tVar2.table_index = in_stack_ffffffffffffff90;
  for (local_38 = 0; local_38 < uVar1; local_38 = local_38 + 1) {
    tVar2 = Read<duckdb::ColumnBinding>((Deserializer *)tVar2.table_index);
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::push_back
              ((vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
               tVar2.table_index,(value_type *)tVar2.column_index);
  }
  (**(code **)(*in_RSI + 0x48))();
  return in_RDI;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}